

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O0

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  size_type sVar4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar5;
  uchar *ptr_6;
  uchar *outptr_6;
  int size_3;
  int p_2;
  Mat *top_blob_6;
  int positive_indice_6;
  int indice_6;
  int slice_6;
  size_t i_6;
  int q_6;
  int channels_3;
  int d_3;
  int h_5;
  int w_6;
  uchar *ptr_5;
  int k;
  int j_2;
  Mat m_3;
  uchar *outptr_5;
  int p_1;
  Mat *top_blob_5;
  int positive_indice_5;
  int indice_5;
  int slice_5;
  size_t i_5;
  int q_5;
  int channels_2;
  int d_2;
  int h_4;
  int w_5;
  uchar *ptr_4;
  uchar *outptr_4;
  int size_2;
  int j_1;
  int p;
  Mat *top_blob_4;
  int positive_indice_4;
  int indice_4;
  int slice_4;
  size_t i_4;
  int q_4;
  int channels_1;
  int d_1;
  int h_3;
  int w_4;
  uchar *outptr_3;
  uchar *ptr_3;
  int size_1;
  Mat *top_blob_3;
  int positive_indice_3;
  int indice_3;
  int slice_3;
  size_t i_3;
  int q_3;
  int channels;
  int d;
  int h_2;
  int w_3;
  uchar *ptr_2;
  uchar *outptr_2;
  int j;
  Mat *top_blob_2;
  int positive_indice_2;
  int indice_2;
  int slice_2;
  size_t i_2;
  int q_2;
  int h_1;
  int w_2;
  uchar *outptr_1;
  uchar *ptr_1;
  int size;
  Mat *top_blob_1;
  int positive_indice_1;
  int indice_1;
  int slice_1;
  size_t i_1;
  int q_1;
  int h;
  int w_1;
  uchar *outptr;
  uchar *ptr;
  Mat *top_blob;
  int positive_indice;
  int indice;
  int slice;
  size_t i;
  int q;
  int w;
  int positive_axis;
  int *indices_ptr;
  int *slices_ptr;
  size_t elemsize;
  int dims;
  Mat *bottom_blob;
  Mat *m_7;
  Mat *m_5;
  Mat *m_2;
  Mat *m;
  Mat *m_6;
  Mat *m_4;
  Mat *m_1;
  Mat *in_stack_ffffffffffffef18;
  void *in_stack_ffffffffffffef20;
  undefined8 *in_stack_ffffffffffffef28;
  Mat *in_stack_ffffffffffffef30;
  undefined4 in_stack_ffffffffffffef90;
  int in_stack_ffffffffffffef94;
  int local_fcc;
  int local_f1c;
  int local_ec4;
  int local_e94;
  int local_e64;
  int local_e34;
  int local_e1c;
  undefined8 local_e10;
  undefined8 local_e08;
  undefined8 local_e00;
  undefined4 local_df8;
  Allocator *local_df0;
  undefined4 local_de8;
  undefined4 local_de4;
  undefined4 local_de0;
  undefined4 local_ddc;
  undefined4 local_dd8;
  undefined8 local_dd0;
  Mat local_dc8;
  void *local_d80;
  undefined8 local_d78;
  undefined8 local_d70;
  undefined8 local_d68;
  undefined4 local_d60;
  Allocator *local_d58;
  undefined4 local_d50;
  undefined4 local_d4c;
  undefined4 local_d48;
  undefined4 local_d44;
  undefined4 local_d40;
  undefined8 local_d38;
  void *local_d30;
  int local_d28;
  int local_d24;
  reference local_d20;
  int local_d14;
  int local_d10;
  int local_d0c;
  ulong local_d08;
  int local_cfc;
  int local_cf8;
  int local_cf4;
  int local_cf0;
  int local_cec;
  undefined8 local_ce8;
  undefined8 local_ce0;
  undefined8 local_cd8;
  undefined4 local_cd0;
  Allocator *local_cc8;
  undefined4 local_cc0;
  undefined4 local_cbc;
  undefined4 local_cb8;
  undefined4 local_cb4;
  undefined4 local_cb0;
  undefined8 local_ca8;
  void *local_ca0;
  int local_c98;
  int local_c94;
  void *local_c90;
  int *local_c88;
  ulong local_c80;
  int local_c78;
  Allocator *local_c70;
  int local_c68;
  int local_c64;
  int local_c60;
  undefined4 local_c5c;
  int local_c58;
  ulong local_c50;
  undefined8 local_c48;
  undefined8 local_c40;
  undefined8 local_c38;
  undefined4 local_c30;
  Allocator *local_c28;
  undefined4 local_c20;
  undefined4 local_c1c;
  undefined4 local_c18;
  undefined4 local_c14;
  undefined4 local_c10;
  undefined8 local_c08;
  void *local_c00;
  int local_bf4;
  reference local_bf0;
  int local_be4;
  int local_be0;
  int local_bdc;
  ulong local_bd8;
  int local_bcc;
  int local_bc8;
  int local_bc4;
  int local_bc0;
  int local_bbc;
  undefined8 local_bb8;
  undefined8 local_bb0;
  undefined8 local_ba8;
  undefined4 local_ba0;
  Allocator *local_b98;
  undefined4 local_b90;
  undefined4 local_b8c;
  undefined4 local_b88;
  undefined4 local_b84;
  undefined4 local_b80;
  undefined8 local_b78;
  undefined8 local_b70;
  undefined8 local_b68;
  undefined8 local_b60;
  undefined4 local_b58;
  Allocator *local_b50;
  undefined4 local_b48;
  undefined4 local_b44;
  undefined4 local_b40;
  undefined4 local_b3c;
  undefined4 local_b38;
  undefined8 local_b30;
  void *local_b28;
  undefined8 local_b20;
  undefined8 local_b18;
  undefined8 local_b10;
  undefined4 local_b08;
  Allocator *local_b00;
  undefined4 local_af8;
  undefined4 local_af4;
  undefined4 local_af0;
  undefined4 local_aec;
  undefined4 local_ae8;
  undefined8 local_ae0;
  undefined8 local_ad8;
  undefined8 local_ad0;
  undefined8 local_ac8;
  undefined4 local_ac0;
  Allocator *local_ab8;
  undefined4 local_ab0;
  undefined4 local_aac;
  undefined4 local_aa8;
  undefined4 local_aa4;
  undefined4 local_aa0;
  undefined8 local_a98;
  void *local_a90;
  int local_a84;
  int local_a80;
  int local_a7c;
  reference local_a78;
  int local_a6c;
  int local_a68;
  int local_a64;
  ulong local_a60;
  int local_a54;
  int local_a50;
  int local_a4c;
  int local_a48;
  int local_a44;
  void *local_a40;
  undefined8 local_a28;
  undefined8 local_a20;
  undefined8 local_a18;
  undefined4 local_a10;
  Allocator *local_a08;
  undefined4 local_a00;
  undefined4 local_9fc;
  undefined4 local_9f8;
  undefined4 local_9f4;
  undefined4 local_9f0;
  undefined8 local_9e8;
  void *local_9e0;
  int local_9d4;
  reference local_9d0;
  int local_9c4;
  int local_9c0;
  int local_9bc;
  ulong local_9b8;
  int local_9ac;
  int local_9a8;
  int local_9a4;
  int local_9a0;
  int local_99c;
  void *local_998;
  void *local_990;
  int local_984;
  reference local_980;
  int local_974;
  int local_970;
  int local_96c;
  ulong local_968;
  int local_95c;
  int local_958;
  int local_954;
  void *local_950;
  void *local_948;
  int local_93c;
  reference local_938;
  int local_92c;
  int local_928;
  int local_924;
  ulong local_920;
  int local_914;
  int local_910;
  int local_90c;
  void *local_908;
  void *local_900;
  reference local_8f8;
  int local_8ec;
  int local_8e8;
  int local_8e4;
  ulong local_8e0;
  int local_8d4;
  int local_8d0;
  int local_8cc;
  long local_8c8;
  long local_8c0;
  size_t local_8b8;
  int local_8ac;
  const_reference local_8a8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_898;
  undefined8 *local_878;
  undefined8 *local_868;
  undefined8 *local_858;
  undefined8 *local_848;
  undefined8 *local_838;
  undefined8 *local_828;
  undefined8 *local_818;
  void **local_808;
  undefined8 *local_7f8;
  Mat *local_7e8;
  undefined8 *local_7d8;
  long *local_7c8;
  long *local_7c0;
  reference local_7b8;
  reference local_7b0;
  reference local_7a8;
  reference local_7a0;
  reference local_798;
  reference local_790;
  reference local_788;
  Mat *local_780;
  undefined8 *local_778;
  const_reference local_770;
  undefined8 *local_768;
  undefined8 *local_760;
  undefined8 *local_758;
  reference local_750;
  reference local_748;
  reference local_740;
  int local_734;
  undefined8 *local_730;
  int local_724;
  undefined8 *local_720;
  int local_714;
  const_reference local_710;
  int local_704;
  const_reference local_700;
  int local_6f4;
  reference local_6f0;
  undefined1 local_6e5;
  int local_6e4;
  const_reference local_6e0;
  undefined8 *local_6d8;
  undefined1 local_6c5;
  int local_6c4;
  const_reference local_6c0;
  void **local_6b8;
  undefined1 local_6a5;
  int local_6a4;
  const_reference local_6a0;
  undefined8 *local_698;
  undefined1 local_685;
  int local_684;
  const_reference local_680;
  undefined8 *local_678;
  undefined1 local_665;
  int local_664;
  reference local_660;
  undefined8 *local_658;
  undefined1 local_645;
  int local_644;
  reference local_640;
  undefined8 *local_638;
  undefined1 local_625;
  int local_624;
  reference local_620;
  undefined8 *local_618;
  int local_604;
  undefined8 *local_600;
  undefined8 *local_5f8;
  int local_5ec;
  undefined8 *local_5e8;
  Mat *local_5e0;
  int local_5d4;
  void **local_5d0;
  undefined8 *local_5c8;
  int local_5bc;
  undefined8 *local_5b8;
  undefined8 *local_5b0;
  undefined8 *local_520;
  Mat *local_500;
  undefined8 *local_4e0;
  int local_4c8;
  undefined4 local_4c4;
  void **local_4c0;
  undefined8 *local_4a0;
  undefined8 *local_480;
  undefined8 *local_460;
  undefined8 *local_440;
  undefined8 *local_420;
  undefined8 *local_400;
  undefined8 *local_3e0;
  void *local_368;
  reference local_2f0;
  reference local_2e8;
  reference local_2e0;
  reference local_2d8;
  reference local_2d0;
  reference local_2c8;
  reference local_2c0;
  Allocator *local_2b8;
  int local_2ac;
  size_t local_2a8;
  void *local_2a0;
  int local_294;
  int local_290;
  int local_28c;
  undefined8 *local_288;
  Allocator *local_280;
  int local_274;
  size_t local_270;
  void *local_268;
  int local_25c;
  int local_258;
  int local_254;
  undefined8 *local_250;
  Allocator *local_248;
  int local_23c;
  size_t local_238;
  void *local_230;
  int local_224;
  int local_220;
  int local_21c;
  undefined8 *local_218;
  Allocator *local_210;
  int local_204;
  size_t local_200;
  void *local_1f8;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  undefined8 *local_1e0;
  Allocator *local_1d8;
  int local_1cc;
  size_t local_1c8;
  void *local_1c0;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  undefined8 *local_1a8;
  Allocator *local_1a0;
  int local_194;
  ulong local_190;
  void *local_188;
  int local_17c;
  int local_178;
  int local_174;
  void **local_170;
  Allocator *local_168;
  int local_15c;
  size_t local_158;
  void *local_150;
  int local_144;
  int local_140;
  int local_13c;
  undefined8 *local_138;
  undefined4 local_12c;
  long local_128;
  undefined4 local_11c;
  long local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  long local_f8;
  undefined4 local_ec;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  Allocator *local_c0;
  int local_b4;
  size_t local_b0;
  void *local_a8;
  int local_a0;
  int local_9c;
  undefined8 *local_98;
  Allocator *local_90;
  int local_84;
  ulong local_80;
  void *local_78;
  int local_70;
  int local_6c;
  undefined8 *local_68;
  Allocator *local_60;
  int local_54;
  size_t local_50;
  void *local_48;
  int local_40;
  int local_3c;
  Mat *local_38;
  Allocator *local_30;
  int local_24;
  size_t local_20;
  void *local_18;
  int local_10;
  int local_c;
  undefined8 *local_8;
  
  local_898 = in_RDX;
  local_8a8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_8ac = local_8a8->dims;
  local_8b8 = local_8a8->elemsize;
  local_7c0 = (long *)(in_RDI + 0xd0);
  local_8c0 = *local_7c0;
  local_7c8 = (long *)(in_RDI + 0x118);
  local_8c8 = *local_7c8;
  if (*(int *)(in_RDI + 0x160) < 0) {
    local_e1c = local_8ac + *(int *)(in_RDI + 0x160);
  }
  else {
    local_e1c = *(int *)(in_RDI + 0x160);
  }
  local_8cc = local_e1c;
  if (local_8ac == 1) {
    local_8d0 = local_8a8->w;
    local_8d4 = 0;
    local_8ac = 1;
    for (local_8e0 = 0; uVar1 = local_8e0,
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_898),
        uVar2 = local_8e0, uVar1 < sVar4; local_8e0 = local_8e0 + 1) {
      if (local_8c8 == 0) {
        local_8e4 = *(int *)(local_8c0 + local_8e0 * 4);
        if (local_8e4 == -0xe9) {
          iVar3 = local_8d0 - local_8d4;
          sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_898);
          local_8e4 = (int)((ulong)(long)iVar3 / (sVar4 - local_8e0));
        }
      }
      else {
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_898);
        if (uVar2 == sVar4 - 1) {
          local_8e4 = local_8d0 - local_8d4;
        }
        else {
          local_8e8 = *(int *)(local_8c8 + local_8e0 * 4);
          local_e34 = local_8e8;
          if (local_8e8 < 0) {
            local_e34 = local_8d0 + local_8e8;
          }
          local_8ec = local_e34;
          local_8e4 = local_e34 - local_8d4;
        }
      }
      local_8f8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_898,local_8e0);
      Mat::create(in_stack_ffffffffffffef30,(int)((ulong)in_stack_ffffffffffffef28 >> 0x20),
                  (size_t)in_stack_ffffffffffffef20,(Allocator *)in_stack_ffffffffffffef18);
      local_788 = local_8f8;
      bVar5 = true;
      if (local_8f8->data != (void *)0x0) {
        local_2f0 = local_8f8;
        bVar5 = local_8f8->cstep * (long)local_8f8->c == 0;
      }
      if (bVar5) {
        return -100;
      }
      local_770 = local_8a8;
      local_900 = (void *)((long)local_8a8->data + (long)local_8d4 * local_8b8);
      local_740 = local_8f8;
      local_908 = local_8f8->data;
      memcpy(local_908,local_900,(long)local_8e4 * local_8b8);
      local_8d4 = local_8e4 + local_8d4;
    }
  }
  else if ((local_8ac == 2) && (local_e1c == 0)) {
    local_90c = local_8a8->w;
    local_910 = local_8a8->h;
    local_914 = 0;
    local_8ac = 2;
    for (local_920 = 0; uVar1 = local_920,
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_898),
        uVar2 = local_920, uVar1 < sVar4; local_920 = local_920 + 1) {
      if (local_8c8 == 0) {
        local_924 = *(int *)(local_8c0 + local_920 * 4);
        if (local_924 == -0xe9) {
          iVar3 = local_910 - local_914;
          sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_898);
          local_924 = (int)((ulong)(long)iVar3 / (sVar4 - local_920));
        }
      }
      else {
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_898);
        if (uVar2 == sVar4 - 1) {
          local_924 = local_910 - local_914;
        }
        else {
          local_928 = *(int *)(local_8c8 + local_920 * 4);
          local_e64 = local_928;
          if (local_928 < 0) {
            local_e64 = local_910 + local_928;
          }
          local_92c = local_e64;
          local_924 = local_e64 - local_914;
        }
      }
      local_938 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_898,local_920);
      Mat::create(in_stack_ffffffffffffef30,(int)((ulong)in_stack_ffffffffffffef28 >> 0x20),
                  (int)in_stack_ffffffffffffef28,(size_t)in_stack_ffffffffffffef20,
                  (Allocator *)in_stack_ffffffffffffef18);
      local_790 = local_938;
      bVar5 = true;
      if (local_938->data != (void *)0x0) {
        local_2e8 = local_938;
        bVar5 = local_938->cstep * (long)local_938->c == 0;
      }
      if (bVar5) {
        return -100;
      }
      local_93c = local_90c * local_924;
      local_700 = local_8a8;
      local_704 = local_914;
      local_948 = (void *)((long)local_8a8->data +
                          (long)local_8a8->w * (long)local_914 * local_8a8->elemsize);
      local_748 = local_938;
      local_950 = local_938->data;
      memcpy(local_950,local_948,(long)local_93c * local_8b8);
      local_914 = local_924 + local_914;
    }
  }
  else if ((local_8ac == 2) && (local_e1c == 1)) {
    local_954 = local_8a8->w;
    local_958 = local_8a8->h;
    local_95c = 0;
    local_8ac = 2;
    for (local_968 = 0; uVar1 = local_968,
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_898),
        uVar2 = local_968, uVar1 < sVar4; local_968 = local_968 + 1) {
      if (local_8c8 == 0) {
        local_96c = *(int *)(local_8c0 + local_968 * 4);
        if (local_96c == -0xe9) {
          iVar3 = local_954 - local_95c;
          sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_898);
          local_96c = (int)((ulong)(long)iVar3 / (sVar4 - local_968));
        }
      }
      else {
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_898);
        if (uVar2 == sVar4 - 1) {
          local_96c = local_954 - local_95c;
        }
        else {
          local_970 = *(int *)(local_8c8 + local_968 * 4);
          local_e94 = local_970;
          if (local_970 < 0) {
            local_e94 = local_954 + local_970;
          }
          local_974 = local_e94;
          local_96c = local_e94 - local_95c;
        }
      }
      local_980 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_898,local_968);
      Mat::create(in_stack_ffffffffffffef30,(int)((ulong)in_stack_ffffffffffffef28 >> 0x20),
                  (int)in_stack_ffffffffffffef28,(size_t)in_stack_ffffffffffffef20,
                  (Allocator *)in_stack_ffffffffffffef18);
      local_798 = local_980;
      bVar5 = true;
      if (local_980->data != (void *)0x0) {
        local_2e0 = local_980;
        bVar5 = local_980->cstep * (long)local_980->c == 0;
      }
      if (bVar5) {
        return -100;
      }
      for (local_984 = 0; local_984 < local_958; local_984 = local_984 + 1) {
        local_6f0 = local_980;
        local_6f4 = local_984;
        local_990 = (void *)((long)local_980->data +
                            (long)local_980->w * (long)local_984 * local_980->elemsize);
        local_710 = local_8a8;
        local_714 = local_984;
        local_998 = (void *)((long)local_8a8->data +
                            (long)local_95c * local_8b8 +
                            (long)local_8a8->w * (long)local_984 * local_8a8->elemsize);
        memcpy(local_990,local_998,(long)local_96c * local_8b8);
      }
      local_95c = local_96c + local_95c;
    }
  }
  else if (((local_8ac == 3) || (local_8ac == 4)) && (local_e1c == 0)) {
    local_99c = local_8a8->w;
    local_9a0 = local_8a8->h;
    local_9a4 = local_8a8->d;
    local_9a8 = local_8a8->c;
    local_9ac = 0;
    for (local_9b8 = 0; uVar1 = local_9b8,
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_898),
        uVar2 = local_9b8, uVar1 < sVar4; local_9b8 = local_9b8 + 1) {
      if (local_8c8 == 0) {
        local_9bc = *(int *)(local_8c0 + local_9b8 * 4);
        if (local_9bc == -0xe9) {
          iVar3 = local_9a8 - local_9ac;
          sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_898);
          local_9bc = (int)((ulong)(long)iVar3 / (sVar4 - local_9b8));
        }
      }
      else {
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_898);
        if (uVar2 == sVar4 - 1) {
          local_9bc = local_9a8 - local_9ac;
        }
        else {
          local_9c0 = *(int *)(local_8c8 + local_9b8 * 4);
          local_ec4 = local_9c0;
          if (local_9c0 < 0) {
            local_ec4 = local_9a8 + local_9c0;
          }
          local_9c4 = local_ec4;
          local_9bc = local_ec4 - local_9ac;
        }
      }
      local_9d0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_898,local_9b8);
      Mat::create(in_stack_ffffffffffffef30,(int)((ulong)in_stack_ffffffffffffef28 >> 0x20),
                  (int)in_stack_ffffffffffffef28,(int)((ulong)in_stack_ffffffffffffef20 >> 0x20),
                  (int)in_stack_ffffffffffffef20,(size_t)in_stack_ffffffffffffef18,
                  (Allocator *)CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90));
      bVar5 = true;
      if (local_9d0->data != (void *)0x0) {
        local_2d8 = local_9d0;
        bVar5 = local_9d0->cstep * (long)local_9d0->c == 0;
      }
      if (bVar5) {
        return -100;
      }
      local_9d0->dims = local_8ac;
      local_9d4 = (int)local_8a8->cstep * local_9bc;
      local_678 = &local_a28;
      local_1e4 = local_8a8->w;
      local_1e8 = local_8a8->h;
      local_1ec = local_8a8->d;
      local_9e0 = (void *)((long)local_8a8->data +
                          local_8a8->cstep * (long)local_9ac * local_8a8->elemsize);
      local_200 = local_8a8->elemsize;
      local_204 = local_8a8->elempack;
      local_210 = local_8a8->allocator;
      local_1e0 = &local_a28;
      local_f8 = (long)local_1e4 * (long)local_1e8 * local_200;
      local_778 = &local_a28;
      local_878 = &local_a28;
      local_fc = 0x10;
      local_680 = local_8a8;
      local_684 = local_9ac;
      local_685 = 1;
      local_7a0 = local_9d0;
      local_a28 = 0;
      local_a18 = 0;
      local_a10 = 0;
      local_a00 = 0;
      local_9fc = 0;
      local_9f8 = 0;
      local_9f4 = 0;
      local_9f0 = 0;
      local_9e8 = 0;
      local_a20 = 0;
      local_750 = local_9d0;
      local_a40 = local_9d0->data;
      local_3e0 = local_878;
      local_1f8 = local_9e0;
      local_a08 = local_210;
      memcpy(local_a40,local_9e0,(long)local_9d4 * local_8b8);
      local_9ac = local_9bc + local_9ac;
    }
  }
  else if (((local_8ac == 3) && (local_e1c == 1)) || ((local_8ac == 4 && (local_e1c == 2)))) {
    local_a44 = local_8a8->w;
    local_a48 = local_8a8->h;
    local_a4c = local_8a8->d;
    local_a50 = local_8a8->c;
    local_a54 = 0;
    for (local_a60 = 0; uVar1 = local_a60,
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_898),
        uVar2 = local_a60, uVar1 < sVar4; local_a60 = local_a60 + 1) {
      if (local_8c8 == 0) {
        local_a64 = *(int *)(local_8c0 + local_a60 * 4);
        if (local_a64 == -0xe9) {
          iVar3 = local_a48 - local_a54;
          sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_898);
          local_a64 = (int)((ulong)(long)iVar3 / (sVar4 - local_a60));
        }
      }
      else {
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_898);
        if (uVar2 == sVar4 - 1) {
          local_a64 = local_a48 - local_a54;
        }
        else {
          local_a68 = *(int *)(local_8c8 + local_a60 * 4);
          local_f1c = local_a68;
          if (local_a68 < 0) {
            local_f1c = local_a48 + local_a68;
          }
          local_a6c = local_f1c;
          local_a64 = local_f1c - local_a54;
        }
      }
      local_a78 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_898,local_a60);
      Mat::create(in_stack_ffffffffffffef30,(int)((ulong)in_stack_ffffffffffffef28 >> 0x20),
                  (int)in_stack_ffffffffffffef28,(int)((ulong)in_stack_ffffffffffffef20 >> 0x20),
                  (int)in_stack_ffffffffffffef20,(size_t)in_stack_ffffffffffffef18,
                  (Allocator *)CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90));
      local_7a8 = local_a78;
      bVar5 = true;
      if (local_a78->data != (void *)0x0) {
        local_2d0 = local_a78;
        bVar5 = local_a78->cstep * (long)local_a78->c == 0;
      }
      if (bVar5) {
        return -100;
      }
      local_a78->dims = local_8ac;
      for (local_a7c = 0; local_a7c < local_a50; local_a7c = local_a7c + 1) {
        for (local_a80 = 0; local_a80 < local_a4c; local_a80 = local_a80 + 1) {
          local_a84 = local_a44 * local_a64;
          local_618 = &local_b20;
          local_28c = local_a78->w;
          local_290 = local_a78->h;
          local_294 = local_a78->d;
          local_2a0 = (void *)((long)local_a78->data +
                              local_a78->cstep * (long)local_a7c * local_a78->elemsize);
          local_2a8 = local_a78->elemsize;
          local_2ac = local_a78->elempack;
          local_2b8 = local_a78->allocator;
          local_288 = &local_b20;
          local_c8 = (long)local_28c * (long)local_290 * local_2a8;
          local_5f8 = &local_ad8;
          local_600 = &local_b20;
          local_a90 = (void *)((long)local_2a0 +
                              (long)local_28c * (long)local_290 * (long)local_a80 * local_2a8);
          local_8 = &local_ad8;
          local_758 = &local_ad8;
          local_868 = &local_ad8;
          local_858 = &local_b20;
          local_698 = &local_bb8;
          local_1ac = local_8a8->w;
          local_1b0 = local_8a8->h;
          local_1b4 = local_8a8->d;
          local_1c0 = (void *)((long)local_8a8->data +
                              local_8a8->cstep * (long)local_a7c * local_8a8->elemsize);
          local_1c8 = local_8a8->elemsize;
          local_1cc = local_8a8->elempack;
          local_1d8 = local_8a8->allocator;
          local_1a8 = &local_bb8;
          local_108 = (long)local_1ac * (long)local_1b0 * local_1c8;
          local_5b0 = &local_b70;
          local_5b8 = &local_bb8;
          local_a8 = (void *)((long)local_1c0 +
                             (long)local_1ac * (long)local_1b0 * (long)local_a80 * local_1c8);
          local_98 = &local_b70;
          local_720 = &local_b70;
          local_b28 = (void *)((long)local_a8 + (long)local_1ac * (long)local_a54 * local_1c8);
          local_848 = &local_b70;
          local_838 = &local_bb8;
          local_a98 = 0;
          local_aa0 = 0;
          local_aa4 = 0;
          local_aa8 = 0;
          local_aac = 0;
          local_ab0 = 0;
          local_ac0 = 0;
          local_ac8 = 0;
          local_ad0 = 0;
          local_ad8 = 0;
          local_ae8 = 0;
          local_aec = 0;
          local_af0 = 0;
          local_af4 = 0;
          local_b08 = 0;
          local_b10 = 0;
          local_b18 = 0;
          local_b20 = 0;
          local_b30 = 0;
          local_b38 = 0;
          local_b3c = 0;
          local_b40 = 0;
          local_b44 = 0;
          local_b48 = 0;
          local_b58 = 0;
          local_b60 = 0;
          local_b68 = 0;
          local_b70 = 0;
          local_cc = 0x10;
          local_10c = 0x10;
          local_5bc = local_a80;
          local_604 = local_a80;
          local_620 = local_a78;
          local_624 = local_a7c;
          local_625 = 1;
          local_6a0 = local_8a8;
          local_6a4 = local_a7c;
          local_6a5 = 1;
          local_724 = local_a54;
          local_ae0 = 0;
          local_af8 = 0;
          local_bb8 = 0;
          local_ba8 = 0;
          local_ba0 = 0;
          local_b90 = 0;
          local_b8c = 0;
          local_b88 = 0;
          local_b84 = 0;
          local_b80 = 0;
          local_b78 = 0;
          local_bb0 = 0;
          local_460 = local_838;
          local_440 = local_848;
          local_420 = local_858;
          local_400 = local_868;
          local_c0 = local_1d8;
          local_b4 = local_1cc;
          local_b0 = local_1c8;
          local_a0 = local_1b0;
          local_9c = local_1ac;
          local_30 = local_2b8;
          local_24 = local_2ac;
          local_20 = local_2a8;
          local_18 = local_a90;
          local_10 = local_290;
          local_c = local_28c;
          local_b98 = local_1d8;
          local_b50 = local_1d8;
          local_b00 = local_2b8;
          local_ab8 = local_2b8;
          memcpy(local_a90,local_b28,(long)local_a84 * local_8b8);
        }
      }
      local_a54 = local_a64 + local_a54;
    }
  }
  else if (((local_8ac == 3) && (local_e1c == 2)) || ((local_8ac == 4 && (local_e1c == 3)))) {
    local_bbc = local_8a8->w;
    local_bc0 = local_8a8->h;
    local_bc4 = local_8a8->d;
    local_bc8 = local_8a8->c;
    local_bcc = 0;
    for (local_bd8 = 0; uVar1 = local_bd8,
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_898),
        uVar2 = local_bd8, uVar1 < sVar4; local_bd8 = local_bd8 + 1) {
      if (local_8c8 == 0) {
        local_bdc = *(int *)(local_8c0 + local_bd8 * 4);
        if (local_bdc == -0xe9) {
          iVar3 = local_bbc - local_bcc;
          sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_898);
          local_bdc = (int)((ulong)(long)iVar3 / (sVar4 - local_bd8));
        }
      }
      else {
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_898);
        if (uVar2 == sVar4 - 1) {
          local_bdc = local_bbc - local_bcc;
        }
        else {
          local_be0 = *(int *)(local_8c8 + local_bd8 * 4);
          local_fcc = local_be0;
          if (local_be0 < 0) {
            local_fcc = local_bbc + local_be0;
          }
          local_be4 = local_fcc;
          local_bdc = local_fcc - local_bcc;
        }
      }
      local_bf0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_898,local_bd8);
      Mat::create(in_stack_ffffffffffffef30,(int)((ulong)in_stack_ffffffffffffef28 >> 0x20),
                  (int)in_stack_ffffffffffffef28,(int)((ulong)in_stack_ffffffffffffef20 >> 0x20),
                  (int)in_stack_ffffffffffffef20,(size_t)in_stack_ffffffffffffef18,
                  (Allocator *)CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90));
      local_7b0 = local_bf0;
      bVar5 = true;
      if (local_bf0->data != (void *)0x0) {
        local_2c8 = local_bf0;
        bVar5 = local_bf0->cstep * (long)local_bf0->c == 0;
      }
      if (bVar5) {
        return -100;
      }
      local_bf0->dims = local_8ac;
      for (local_bf4 = 0; local_bf4 < local_bc8; local_bf4 = local_bf4 + 1) {
        local_638 = &local_c48;
        local_254 = local_bf0->w;
        local_258 = local_bf0->h;
        local_25c = local_bf0->d;
        local_c00 = (void *)((long)local_bf0->data +
                            local_bf0->cstep * (long)local_bf4 * local_bf0->elemsize);
        local_270 = local_bf0->elemsize;
        local_274 = local_bf0->elempack;
        local_280 = local_bf0->allocator;
        local_250 = &local_c48;
        local_d8 = (long)local_254 * (long)local_258 * local_270;
        local_760 = &local_c48;
        local_828 = &local_c48;
        local_dc = 0x10;
        local_640 = local_bf0;
        local_644 = local_bf4;
        local_645 = 1;
        local_6b8 = &local_c90;
        local_174 = local_8a8->w;
        local_178 = local_8a8->h;
        local_17c = local_8a8->d;
        local_188 = (void *)((long)local_8a8->data +
                            local_8a8->cstep * (long)local_bf4 * local_8a8->elemsize);
        local_190 = local_8a8->elemsize;
        local_194 = local_8a8->elempack;
        local_1a0 = local_8a8->allocator;
        local_170 = &local_c90;
        local_118 = (long)local_174 * (long)local_178 * local_190;
        local_c50 = (local_118 + 0xfU & 0xfffffffffffffff0) / local_190;
        local_c68 = local_8a8->dims + -1;
        if (local_8a8->dims == 4) {
          local_c50 = (long)local_8a8->w * (long)local_8a8->h;
        }
        local_c10 = 0;
        local_c14 = 0;
        local_c18 = 0;
        local_c1c = 0;
        local_c30 = 0;
        local_c38 = 0;
        local_c40 = 0;
        local_c48 = 0;
        local_c5c = 1;
        local_11c = 0x10;
        local_6c0 = local_8a8;
        local_6c4 = local_bf4;
        local_6c5 = 1;
        local_c08 = 0;
        local_c20 = 0;
        local_c88 = (int *)0x0;
        local_480 = local_828;
        local_268 = local_c00;
        local_c90 = local_188;
        local_c80 = local_190;
        local_c78 = local_194;
        local_c70 = local_1a0;
        local_c64 = local_174;
        local_c60 = local_178;
        local_c58 = local_17c;
        local_c28 = local_280;
        for (local_c94 = 0; local_c94 < local_bc4; local_c94 = local_c94 + 1) {
          for (local_c98 = 0; local_c98 < local_bc0; local_c98 = local_c98 + 1) {
            local_5c8 = &local_ce8;
            local_5d0 = &local_c90;
            local_78 = (void *)((long)local_c90 +
                               (long)local_c64 * (long)local_c60 * (long)local_c94 * local_c80);
            local_68 = &local_ce8;
            local_730 = &local_ce8;
            local_ca0 = (void *)((long)local_78 +
                                (long)local_bcc * local_8b8 +
                                (long)local_c64 * (long)local_c98 * local_c80);
            local_818 = &local_ce8;
            local_cc8 = local_c70;
            local_6c = local_c64;
            local_70 = local_c60;
            local_80 = local_c80;
            local_84 = local_c78;
            local_90 = local_c70;
            local_5d4 = local_c94;
            local_734 = local_c98;
            local_ce8 = 0;
            local_cd8 = 0;
            local_cd0 = 0;
            local_cc0 = 0;
            local_cbc = 0;
            local_cb8 = 0;
            local_cb4 = 0;
            local_cb0 = 0;
            local_ca8 = 0;
            local_ce0 = 0;
            local_4a0 = local_818;
            memcpy(local_c00,local_ca0,(long)local_bdc * local_8b8);
            local_c00 = (void *)((long)local_bdc * local_8b8 + (long)local_c00);
          }
        }
        local_808 = &local_c90;
        local_4c0 = local_808;
        if (local_c88 != (int *)0x0) {
          local_4c4 = 0xffffffff;
          LOCK();
          local_4c8 = *local_c88;
          *local_c88 = *local_c88 + -1;
          UNLOCK();
          if (local_4c8 == 1) {
            if (local_c70 == (Allocator *)0x0) {
              local_368 = local_c90;
              if (local_c90 != (void *)0x0) {
                free(local_c90);
              }
            }
            else {
              (*local_c70->_vptr_Allocator[3])(local_c70,local_c90);
            }
          }
        }
        local_c90 = (void *)0x0;
        local_c80 = 0;
        local_c78 = 0;
        local_c68 = 0;
        local_c64 = 0;
        local_c60 = 0;
        local_c5c = 0;
        local_c58 = 0;
        local_c50 = 0;
        local_c88 = (int *)0x0;
      }
      local_bcc = local_bdc + local_bcc;
    }
  }
  else if ((local_8ac == 4) && (local_e1c == 1)) {
    local_cec = local_8a8->w;
    local_cf0 = local_8a8->h;
    local_cf4 = local_8a8->d;
    local_cf8 = local_8a8->c;
    local_cfc = 0;
    local_8ac = 4;
    for (local_d08 = 0; uVar1 = local_d08,
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_898),
        uVar2 = local_d08, uVar1 < sVar4; local_d08 = local_d08 + 1) {
      if (local_8c8 == 0) {
        local_d0c = *(int *)(local_8c0 + local_d08 * 4);
        if (local_d0c == -0xe9) {
          iVar3 = local_cf4 - local_cfc;
          sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_898);
          local_d0c = (int)((ulong)(long)iVar3 / (sVar4 - local_d08));
        }
      }
      else {
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_898);
        if (uVar2 == sVar4 - 1) {
          local_d0c = local_cf4 - local_cfc;
        }
        else {
          local_d10 = *(int *)(local_8c8 + local_d08 * 4);
          in_stack_ffffffffffffef94 = local_d10;
          if (local_d10 < 0) {
            in_stack_ffffffffffffef94 = local_cf4 + local_d10;
          }
          local_d0c = in_stack_ffffffffffffef94 - local_cfc;
          local_d14 = in_stack_ffffffffffffef94;
        }
      }
      local_d20 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_898,local_d08);
      Mat::create(in_stack_ffffffffffffef30,(int)((ulong)in_stack_ffffffffffffef28 >> 0x20),
                  (int)in_stack_ffffffffffffef28,(int)((ulong)in_stack_ffffffffffffef20 >> 0x20),
                  (int)in_stack_ffffffffffffef20,(size_t)in_stack_ffffffffffffef18,
                  (Allocator *)CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90));
      local_7b8 = local_d20;
      bVar5 = true;
      if (local_d20->data != (void *)0x0) {
        local_2c0 = local_d20;
        bVar5 = local_d20->cstep * (long)local_d20->c == 0;
      }
      if (bVar5) {
        return -100;
      }
      for (local_d24 = 0; local_d24 < local_cf8; local_d24 = local_d24 + 1) {
        local_d28 = local_cec * local_cf0 * local_d0c;
        local_658 = &local_d78;
        local_21c = local_d20->w;
        local_220 = local_d20->h;
        local_224 = local_d20->d;
        local_d30 = (void *)((long)local_d20->data +
                            local_d20->cstep * (long)local_d24 * local_d20->elemsize);
        local_238 = local_d20->elemsize;
        local_23c = local_d20->elempack;
        local_248 = local_d20->allocator;
        local_218 = &local_d78;
        local_e8 = (long)local_21c * (long)local_220 * local_238;
        local_768 = &local_d78;
        local_7f8 = &local_d78;
        local_6d8 = &local_e10;
        local_13c = local_8a8->w;
        local_140 = local_8a8->h;
        local_144 = local_8a8->d;
        local_150 = (void *)((long)local_8a8->data +
                            local_8a8->cstep * (long)local_d24 * local_8a8->elemsize);
        local_158 = local_8a8->elemsize;
        local_15c = local_8a8->elempack;
        local_168 = local_8a8->allocator;
        local_138 = &local_e10;
        local_128 = (long)local_13c * (long)local_140 * local_158;
        local_5e0 = &local_dc8;
        in_stack_ffffffffffffef28 = &local_e10;
        in_stack_ffffffffffffef20 =
             (void *)((long)local_150 +
                     (long)local_13c * (long)local_140 * (long)local_cfc * local_158);
        in_stack_ffffffffffffef30 = &local_dc8;
        local_780 = &local_dc8;
        in_stack_ffffffffffffef18 = &local_dc8;
        local_7d8 = &local_e10;
        local_d40 = 0;
        local_d44 = 0;
        local_d48 = 0;
        local_d4c = 0;
        local_d60 = 0;
        local_d68 = 0;
        local_d70 = 0;
        local_d78 = 0;
        local_dc8.cstep = 0;
        local_dc8.c = 0;
        local_dc8.d = 0;
        local_dc8.h = 0;
        local_dc8.w = 0;
        local_dc8.dims = 0;
        local_dc8.elempack = 0;
        local_dc8.elemsize = 0;
        local_dc8.refcount = (int *)0x0;
        local_dc8.data = (void *)0x0;
        local_ec = 0x10;
        local_12c = 0x10;
        local_5ec = local_cfc;
        local_660 = local_d20;
        local_664 = local_d24;
        local_665 = 1;
        local_6e0 = local_8a8;
        local_6e4 = local_d24;
        local_6e5 = 1;
        local_d38 = 0;
        local_d50 = 0;
        local_e10 = 0;
        local_e00 = 0;
        local_df8 = 0;
        local_de8 = 0;
        local_de4 = 0;
        local_de0 = 0;
        local_ddc = 0;
        local_dd8 = 0;
        local_dd0 = 0;
        local_e08 = 0;
        local_d80 = in_stack_ffffffffffffef20;
        local_7e8 = in_stack_ffffffffffffef18;
        local_5e8 = in_stack_ffffffffffffef28;
        local_520 = local_7d8;
        local_500 = in_stack_ffffffffffffef18;
        local_4e0 = local_7f8;
        local_230 = local_d30;
        local_60 = local_168;
        local_54 = local_15c;
        local_50 = local_158;
        local_48 = in_stack_ffffffffffffef20;
        local_40 = local_140;
        local_3c = local_13c;
        local_38 = in_stack_ffffffffffffef30;
        local_df0 = local_168;
        local_dc8.allocator = local_168;
        local_d58 = local_248;
        memcpy(local_d30,in_stack_ffffffffffffef20,(long)local_d28 * local_8b8);
      }
      local_cfc = local_d0c + local_cfc;
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;
    const int* indices_ptr = indices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice;
            if (indices_ptr)
            {
                if (i == top_blobs.size() - 1)
                {
                    slice = w - q;
                }
                else
                {
                    int indice = indices_ptr[i];
                    int positive_indice = indice < 0 ? w + indice : indice;
                    slice = positive_indice - q;
                }
            }
            else
            {
                slice = slices_ptr[i];
                if (slice == -233)
                {
                    slice = static_cast<int>((w - q) / (top_blobs.size() - i));
                }
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const unsigned char* ptr = (const unsigned char*)bottom_blob + q * elemsize;
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice;
            if (indices_ptr)
            {
                if (i == top_blobs.size() - 1)
                {
                    slice = h - q;
                }
                else
                {
                    int indice = indices_ptr[i];
                    int positive_indice = indice < 0 ? h + indice : indice;
                    slice = positive_indice - q;
                }
            }
            else
            {
                slice = slices_ptr[i];
                if (slice == -233)
                {
                    slice = static_cast<int>((h - q) / (top_blobs.size() - i));
                }
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const unsigned char* ptr = bottom_blob.row<const unsigned char>(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice;
            if (indices_ptr)
            {
                if (i == top_blobs.size() - 1)
                {
                    slice = w - q;
                }
                else
                {
                    int indice = indices_ptr[i];
                    int positive_indice = indice < 0 ? w + indice : indice;
                    slice = positive_indice - q;
                }
            }
            else
            {
                slice = slices_ptr[i];
                if (slice == -233)
                {
                    slice = static_cast<int>((w - q) / (top_blobs.size() - i));
                }
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j = 0; j < h; j++)
            {
                unsigned char* outptr = top_blob.row<unsigned char>(j);
                const unsigned char* ptr = bottom_blob.row<const unsigned char>(j) + q * elemsize;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice;
            if (indices_ptr)
            {
                if (i == top_blobs.size() - 1)
                {
                    slice = channels - q;
                }
                else
                {
                    int indice = indices_ptr[i];
                    int positive_indice = indice < 0 ? channels + indice : indice;
                    slice = positive_indice - q;
                }
            }
            else
            {
                slice = slices_ptr[i];
                if (slice == -233)
                {
                    slice = static_cast<int>((channels - q) / (top_blobs.size() - i));
                }
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, d, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            int size = static_cast<int>(bottom_blob.cstep * slice);

            const unsigned char* ptr = bottom_blob.channel(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice;
            if (indices_ptr)
            {
                if (i == top_blobs.size() - 1)
                {
                    slice = h - q;
                }
                else
                {
                    int indice = indices_ptr[i];
                    int positive_indice = indice < 0 ? h + indice : indice;
                    slice = positive_indice - q;
                }
            }
            else
            {
                slice = slices_ptr[i];
                if (slice == -233)
                {
                    slice = static_cast<int>((h - q) / (top_blobs.size() - i));
                }
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, d, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                for (int j = 0; j < d; j++)
                {
                    int size = w * slice;

                    unsigned char* outptr = top_blob.channel(p).depth(j);
                    const unsigned char* ptr = bottom_blob.channel(p).depth(j).row<const unsigned char>(q);
                    memcpy(outptr, ptr, size * elemsize);
                }
            }

            q += slice;
        }

        return 0;
    }

    if ((dims == 3 && positive_axis == 2) || (dims == 4 && positive_axis == 3))
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice;
            if (indices_ptr)
            {
                if (i == top_blobs.size() - 1)
                {
                    slice = w - q;
                }
                else
                {
                    int indice = indices_ptr[i];
                    int positive_indice = indice < 0 ? w + indice : indice;
                    slice = positive_indice - q;
                }
            }
            else
            {
                slice = slices_ptr[i];
                if (slice == -233)
                {
                    slice = static_cast<int>((w - q) / (top_blobs.size() - i));
                }
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, d, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                unsigned char* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j = 0; j < d; j++)
                {
                    for (int k = 0; k < h; k++)
                    {
                        const unsigned char* ptr = m.depth(j).row<const unsigned char>(k) + q * elemsize;
                        memcpy(outptr, ptr, slice * elemsize);

                        outptr += slice * elemsize;
                    }
                }
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 4 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice;
            if (indices_ptr)
            {
                if (i == top_blobs.size() - 1)
                {
                    slice = d - q;
                }
                else
                {
                    int indice = indices_ptr[i];
                    int positive_indice = indice < 0 ? d + indice : indice;
                    slice = positive_indice - q;
                }
            }
            else
            {
                slice = slices_ptr[i];
                if (slice == -233)
                {
                    slice = static_cast<int>((d - q) / (top_blobs.size() - i));
                }
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                int size = w * h * slice;

                unsigned char* outptr = top_blob.channel(p);
                const unsigned char* ptr = bottom_blob.channel(p).depth(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}